

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring.cpp
# Opt level: O1

ScalarFunctionSet * duckdb::BitStringFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  pointer pSVar1;
  LogicalType varargs;
  LogicalType varargs_00;
  ScalarFunctionSet *in_RDI;
  long lVar2;
  ScalarFunction *func;
  pointer function;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  undefined4 in_stack_fffffffffffffba4;
  undefined4 in_stack_fffffffffffffbac;
  FunctionNullHandling in_stack_fffffffffffffbb8;
  bind_lambda_function_t in_stack_fffffffffffffbc0;
  scalar_function_t local_438;
  scalar_function_t local_418;
  LogicalType local_3f0 [3];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_3a8;
  LogicalType local_390;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_378;
  LogicalType local_360;
  LogicalType local_348;
  ScalarFunction local_330;
  ScalarFunction local_208;
  BaseScalarFunction local_e0;
  
  ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  LogicalType::LogicalType(local_3f0,VARCHAR);
  LogicalType::LogicalType(local_3f0 + 1,INTEGER);
  __l._M_len = 2;
  __l._M_array = local_3f0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_378,__l,(allocator_type *)&stack0xfffffffffffffbc7);
  LogicalType::LogicalType(&local_390,BIT);
  local_418.super__Function_base._M_functor._8_8_ = 0;
  local_418.super__Function_base._M_functor._M_unused._M_object = BitStringFunction<true>;
  local_418._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_418.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_348,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_348;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffffba4;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffffbac;
  ScalarFunction::ScalarFunction
            (&local_208,(vector<duckdb::LogicalType,_true> *)&local_378,&local_390,&local_418,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs,CONSISTENT,
             in_stack_fffffffffffffbb8,in_stack_fffffffffffffbc0);
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_208);
  local_208.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_02476950;
  if (local_208.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_208.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_208.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_208.function.super__Function_base._M_manager)
              ((_Any_data *)&local_208.function,(_Any_data *)&local_208.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_208.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_348);
  if (local_418.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_418.super__Function_base._M_manager)
              ((_Any_data *)&local_418,(_Any_data *)&local_418,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_390);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_378);
  lVar2 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_3f0[0].id_ + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  LogicalType::LogicalType(local_3f0,BIT);
  LogicalType::LogicalType(local_3f0 + 1,INTEGER);
  __l_00._M_len = 2;
  __l_00._M_array = local_3f0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_3a8,__l_00,(allocator_type *)&stack0xfffffffffffffbc7);
  LogicalType::LogicalType(local_3f0 + 2,BIT);
  local_438.super__Function_base._M_functor._8_8_ = 0;
  local_438.super__Function_base._M_functor._M_unused._M_object = BitStringFunction<false>;
  local_438._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_438.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_360,INVALID);
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_00._0_8_ = &local_360;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffffba4;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffffbac;
  ScalarFunction::ScalarFunction
            (&local_330,(vector<duckdb::LogicalType,_true> *)&local_3a8,local_3f0 + 2,&local_438,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_00,CONSISTENT,
             in_stack_fffffffffffffbb8,in_stack_fffffffffffffbc0);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_330);
  local_330.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_02476950;
  if (local_330.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_330.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_330.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_330.function.super__Function_base._M_manager)
              ((_Any_data *)&local_330.function,(_Any_data *)&local_330.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_330.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_360);
  if (local_438.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_438.super__Function_base._M_manager)
              ((_Any_data *)&local_438,(_Any_data *)&local_438,__destroy_functor);
  }
  LogicalType::~LogicalType(local_3f0 + 2);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3a8);
  lVar2 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_3f0[0].id_ + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  function = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
             super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
             super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
             _M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
           super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (function != pSVar1) {
    do {
      BaseScalarFunction::SetReturnsError(&local_e0,&function->super_BaseScalarFunction);
      BaseScalarFunction::~BaseScalarFunction(&local_e0);
      function = function + 1;
    } while (function != pSVar1);
  }
  return in_RDI;
}

Assistant:

ScalarFunctionSet BitStringFun::GetFunctions() {
	ScalarFunctionSet bitstring;
	bitstring.AddFunction(
	    ScalarFunction({LogicalType::VARCHAR, LogicalType::INTEGER}, LogicalType::BIT, BitStringFunction<true>));
	bitstring.AddFunction(
	    ScalarFunction({LogicalType::BIT, LogicalType::INTEGER}, LogicalType::BIT, BitStringFunction<false>));
	for (auto &func : bitstring.functions) {
		BaseScalarFunction::SetReturnsError(func);
	}
	return bitstring;
}